

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

TemporaryCopy __thiscall
spirv_cross::CompilerGLSL::handle_instruction_precision(CompilerGLSL *this,Instruction *instruction)

{
  TemporaryCopy TVar1;
  bool bVar2;
  SPIRExtension *pSVar3;
  pointer ppVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_48;
  iterator itr;
  uint32_t local_38;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t forwarding_length;
  uint32_t length;
  Op opcode;
  uint32_t *ops;
  Instruction *instruction_local;
  CompilerGLSL *this_local;
  
  ops = (uint32_t *)instruction;
  instruction_local = (Instruction *)this;
  _length = Compiler::stream_mutable(&this->super_Compiler,instruction);
  forwarding_length = (uint32_t)(ushort)*ops;
  result_type = ops[2];
  if (((this->backend).requires_relaxed_precision_analysis & 1U) != 0) {
    if (2 < result_type) {
      result_id = result_type - 2;
      bVar2 = opcode_is_precision_sensitive_operation(forwarding_length);
      if (bVar2) {
        analyze_precision_requirements(this,*_length,_length[1],_length + 2,result_id);
      }
      else if (((forwarding_length == 0xc) && (4 < result_type)) &&
              (pSVar3 = Compiler::get<spirv_cross::SPIRExtension>(&this->super_Compiler,_length[2]),
              *(int *)&(pSVar3->super_IVariant).field_0xc == 1)) {
        analyze_precision_requirements(this,*_length,_length[1],_length + 4,result_id - 2);
      }
      else {
        bVar2 = opcode_is_precision_forwarding_instruction(forwarding_length,&result_id);
        if (bVar2) {
          forward_relaxed_precision(this,_length[1],_length + 2,result_id);
        }
      }
    }
    local_38 = 0;
    itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
         0;
    bVar2 = Compiler::instruction_to_result_type
                      (&this->super_Compiler,&local_38,
                       (uint32_t *)
                       ((long)&itr.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 4),forwarding_length,_length,result_type);
    if (bVar2) {
      local_48._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find(&this->temporary_to_mirror_precision_alias,_length + 1);
      local_50._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->temporary_to_mirror_precision_alias);
      bVar2 = ::std::__detail::operator!=(&local_48,&local_50);
      if (bVar2) {
        ppVar4 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_48);
        this_local._0_4_ = ppVar4->second;
        ppVar4 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_48);
        this_local._4_4_ = ppVar4->first;
        goto LAB_00398c03;
      }
    }
  }
  this_local._0_4_ = 0;
  this_local._4_4_ = 0;
LAB_00398c03:
  TVar1.src_id = this_local._4_4_;
  TVar1.dst_id = (uint)this_local;
  return TVar1;
}

Assistant:

CompilerGLSL::TemporaryCopy CompilerGLSL::handle_instruction_precision(const Instruction &instruction)
{
	auto ops = stream_mutable(instruction);
	auto opcode = static_cast<Op>(instruction.op);
	uint32_t length = instruction.length;

	if (backend.requires_relaxed_precision_analysis)
	{
		if (length > 2)
		{
			uint32_t forwarding_length = length - 2;

			if (opcode_is_precision_sensitive_operation(opcode))
				analyze_precision_requirements(ops[0], ops[1], &ops[2], forwarding_length);
			else if (opcode == OpExtInst && length >= 5 && get<SPIRExtension>(ops[2]).ext == SPIRExtension::GLSL)
				analyze_precision_requirements(ops[0], ops[1], &ops[4], forwarding_length - 2);
			else if (opcode_is_precision_forwarding_instruction(opcode, forwarding_length))
				forward_relaxed_precision(ops[1], &ops[2], forwarding_length);
		}

		uint32_t result_type = 0, result_id = 0;
		if (instruction_to_result_type(result_type, result_id, opcode, ops, length))
		{
			auto itr = temporary_to_mirror_precision_alias.find(ops[1]);
			if (itr != temporary_to_mirror_precision_alias.end())
				return { itr->second, itr->first };
		}
	}

	return {};
}